

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::switch_modes(Application *this,uint key)

{
  if ((int)key < 0x61) {
    if (0x51 < (int)key) {
      if (key == 0x52) {
LAB_0019492f:
        to_render_mode(this);
        goto LAB_00194937;
      }
      if (key != 0x56) {
        return;
      }
LAB_0019491b:
      to_visualize_mode(this);
      goto LAB_00194937;
    }
    if (key == 0x41) {
LAB_00194925:
      to_animate_mode(this);
      goto LAB_00194937;
    }
    if (key != 0x4d) {
      return;
    }
  }
  else {
    if (0x71 < (int)key) {
      if (key == 0x72) goto LAB_0019492f;
      if (key != 0x76) {
        return;
      }
      goto LAB_0019491b;
    }
    if (key == 0x61) goto LAB_00194925;
    if (key != 0x6d) {
      return;
    }
  }
  to_model_mode(this);
LAB_00194937:
  setupElementTransformWidget(this);
  return;
}

Assistant:

void Application::switch_modes(unsigned int key) {
  switch (key) {
    case 'a':
    case 'A':
      to_animate_mode();
      setupElementTransformWidget();
      break;
    case 'm':
    case 'M':
      to_model_mode();
      setupElementTransformWidget();
      break;
    case 'r':
    case 'R':
      to_render_mode();
      setupElementTransformWidget();
      break;
    case 'v':
    case 'V':
      to_visualize_mode();
      setupElementTransformWidget();
      break;
    default:
      break;
  }
}